

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_list.c
# Opt level: O2

void clear_elements(void)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  head = (list_entity)ZEXT816(0);
  values[0] = 0;
  values[1] = 0;
  values[2] = 0;
  values[3] = 0;
  values[4] = 0;
  values[5] = 0;
  lVar3 = 0;
  memset(elements1,0,0x90);
  memset(elements2,0,0x90);
  iVar1 = 0;
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    *(int *)((long)&elements1[0].value + lVar3) = (int)lVar2;
    *(int *)((long)&elements2[0].value + lVar3) = iVar1;
    iVar1 = iVar1 + -1;
    lVar3 = lVar3 + 0x18;
  }
  return;
}

Assistant:

static void clear_elements(void) {
  int i;

  memset(&head, 0, sizeof(head));
  memset(values, 0, sizeof(values));
  memset(elements1, 0, sizeof(elements1));
  memset(elements2, 0, sizeof(elements2));

  for (i=0; i<COUNT; i++) {
    elements1[i].value = i;
    elements2[i].value = -i;
  }
}